

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void enumerate(FILE *outf,char *groupname,dotNode *(*results) [7],float probeRad,int method,int nsel
              ,int spike,int outdots,int numSkinDots,float density)

{
  float fVar1;
  dotNode *pdVar2;
  char *pcVar3;
  dotNode_t *pdVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  
  fprintf((FILE *)outf,"        \nsubgroup: %s\n",groupname);
  fprintf((FILE *)outf,"atoms selected: %d\npotential dots: %d\npotential area: %.1f A^2\n",
          (double)((float)numSkinDots / density),(ulong)(uint)nsel,(ulong)(uint)numSkinDots);
  if (nsel < 1 || numSkinDots < 1) {
    fwrite("empty selection\n",0x10,1,(FILE *)outf);
    return;
  }
  pcVar5 = "  type                 #      %%       score score/A^2 x 1000\n";
  if (spike == 0) {
    pcVar5 = "  type                 #      %%\n";
  }
  fprintf((FILE *)outf,pcVar5);
  dVar8 = (double)numSkinDots;
  local_70 = 0.0;
  lVar6 = 0;
  local_6c = 0.0;
  local_68 = 0.0;
  local_64 = 0.0;
  local_74 = 0.0;
  local_90 = 0.0;
  local_8c = 0.0;
  fVar12 = 0.0;
  do {
    uVar7 = 0;
    do {
      pdVar2 = results[lVar6][uVar7];
      if (pdVar2 != (dotNode *)0x0) {
        pcVar5 = getAtomName((int)lVar6);
        pcVar3 = "external_dots ";
        if (outdots == 0) {
          pcVar3 = (char *)((long)&DAT_0013e9c4 + (long)(int)(&DAT_0013e9c4)[uVar7]);
        }
        fprintf((FILE *)outf,"%3s %s ",pcVar5,pcVar3);
        fVar13 = 0.0;
        fVar15 = 0.0;
        fVar14 = 0.0;
        local_84 = 0.0;
        local_88 = 0.0;
        pdVar4 = pdVar2;
        do {
          if (spike == 0) {
            fVar15 = fVar15 + 1.0;
          }
          else if (uVar7 < 3) {
            fVar15 = fVar15 + 1.0;
            dVar10 = (double)(pdVar4->gap / GAPweight);
            dVar10 = exp(-dVar10 * dVar10);
            fVar13 = fVar13 + (float)dVar10;
            local_64 = local_64 + (float)dVar10;
          }
          else {
            fVar1 = pdVar4->gap;
            fVar9 = -fVar1;
            if (-fVar1 <= fVar1) {
              fVar9 = fVar1;
            }
            if ((int)uVar7 - 3U < 3) {
              local_84 = local_84 + 1.0;
              fVar1 = fVar9 * 0.5 * -BUMPweight;
              fVar13 = fVar13 + fVar1;
              local_6c = local_6c + fVar1;
            }
            else {
              local_88 = local_88 + 1.0;
              fVar1 = fVar9 * 0.5 * HBweight;
              fVar13 = fVar13 + fVar1;
              local_68 = local_68 + fVar1;
            }
          }
          if (method == 0) {
            fVar1 = pdVar4->a->radius;
            fVar14 = fVar14 + ((fVar1 + probeRad) * (fVar1 + probeRad)) / (fVar1 * fVar1);
          }
          pdVar4 = pdVar4->next;
        } while (pdVar4 != (dotNode_t *)0x0);
        if (pdVar2 != (dotNode *)0x0) {
          if (spike == 0) {
            fprintf((FILE *)outf,"%7.0f %5.1f%%\n",(double)fVar15,((double)fVar15 * 100.0) / dVar8,
                    (ulong)(uint)density);
          }
          else {
            fVar1 = fVar15;
            if ((2 < uVar7) && (fVar1 = local_88, (int)uVar7 - 3U < 3)) {
              fVar1 = local_84;
            }
            fprintf((FILE *)outf,"%7.0f %5.1f%% %9.1f %9.2f\n",(double)fVar1,
                    ((double)fVar1 * 100.0) / dVar8,(double)(fVar13 / density),
                    ((double)fVar13 * 1000.0) / dVar8);
          }
          fVar12 = fVar12 + fVar15;
          local_8c = local_8c + local_88;
          local_90 = local_90 + local_84;
          local_70 = local_70 + fVar13;
          if (method == 0) {
            local_74 = local_74 + fVar14;
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 7);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x72);
  dVar10 = (double)fVar12;
  dVar11 = (dVar10 * 100.0) / dVar8;
  if (spike == 0) {
    fprintf((FILE *)outf,"             tot:  %7.0f %5.1f%%\n\n",dVar10,dVar11,(ulong)(uint)density);
    fprintf((FILE *)outf,"   contact surface area: %.1f A^2\n",(double)(fVar12 / density));
    if (method != 0) {
      return;
    }
    pcVar5 = "accessible surface area: %.1f A^2\n\n";
  }
  else {
    fprintf((FILE *)outf,"\n     tot contact:  %7.0f %5.1f%% %9.1f %9.2f\n",dVar10,dVar11,
            (double)(local_64 / density),((double)local_64 * 1000.0) / dVar8);
    fprintf((FILE *)outf,"     tot overlap:  %7.0f %5.1f%% %9.1f %9.2f\n",(double)local_90,
            ((double)local_90 * 100.0) / dVar8,(double)(local_6c / density),
            ((double)local_6c * 1000.0) / dVar8);
    fprintf((FILE *)outf,"     tot  H-bond:  %7.0f %5.1f%% %9.1f %9.2f\n",(double)local_8c,
            ((double)local_8c * 100.0) / dVar8,(double)(local_68 / density),
            ((double)local_68 * 1000.0) / dVar8);
    local_74 = fVar12 + local_90 + local_8c;
    fprintf((FILE *)outf,"\n       grand tot:  %7.0f %5.1f%% %9.1f %9.2f\n",(double)local_74,
            ((double)local_74 * 100.0) / dVar8,(double)(local_70 / density),
            ((double)local_70 * 1000.0) / dVar8);
    pcVar5 = "\ncontact surface area: %.1f A^2\n";
  }
  fprintf((FILE *)outf,pcVar5,(double)(local_74 / density));
  return;
}

Assistant:

void enumerate(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
               float probeRad, int method,
	       int nsel, int spike, int outdots, int numSkinDots,
	       float density)
{
   int i, j, doit;
   float gs, hs, bs, hslen, bslen, tgs, ths, tbs, thslen, tbslen, psas, tsas;
   float dtgp, score, tGscore, tHscore, tBscore, tscore, scoreValue, a_radius;
   double scaledGap, slen;
   dotNode *node;
  /* char *mast[NODEWIDTH] = {"wide_contact  ", "close_contact ",
                            "small_overlap ", "bad_overlap   ", "H-bond        "};*/
    /* 04/10/2015 SJ changed to match the new categories, see NODEWIDTH in probe.h*/
    char *mast[NODEWIDTH] = {"wide_contact","close_contact","weak_H-bond","small_overlap","bad_overlap","worse_overlap","H-bond"};

   /* psas and tsas are the partial and total solvent accessible surface */

   fprintf(outf, "        \nsubgroup: %s\n", groupname);
   fprintf(outf, "atoms selected: %d\npotential dots: %d\npotential area: %.1f A^2\n",
				 nsel, numSkinDots, numSkinDots/density);

   if (nsel <= 0 || numSkinDots <= 0) {
      fprintf(outf, "empty selection\n");
      return;
   }
   if (spike) {
      fprintf(outf, "  type                 #      %%       score score/A^2 x 1000\n");
   }
   else {
      fprintf(outf, "  type                 #      %%\n");
   }

   tgs = ths = thslen = tbs = tbslen = tsas = 0.0;
   tGscore = tHscore = tBscore = tscore = 0.0;
   for (i = 0; i < NUMATOMTYPES; i++)
   {
       for (j = 0; j < NODEWIDTH; j++)
       {
           gs = hs = hslen = bs = bslen = score = psas = 0.0;
           node = results[i][j];
           doit = (node != NULL);
           if (doit) {
               fprintf(outf, "%3s %s ", getAtomName(i),
	                   outdots?"external_dots ":mast[j]);
           }
           while(node)
           {
               if (spike)/* 04/10/2015 SJ changed the if statements in this block to reflect change in dots ordering, see NODEWIDTH in probe.h*/
               {
                  // if (j == 0 || j == 1) { /* contact dot */
                   if(j==0 || j ==1 || j ==2) { /* contact dot, and weak H bond*/
                       gs += 1.0;
                       dtgp = node->gap;
                       scaledGap = dtgp/GAPweight;
                       scoreValue = exp(-scaledGap*scaledGap);
                       score   += scoreValue;
                       tGscore += scoreValue;
                   }
                  // else if (j == 2 || j == 3) { /* bump */
                   else if (j ==3 || j ==4 || j ==5){ /* bump*/
                       bs += 1.0;
                       slen = 0.5*FABS(node->gap);
                       bslen += slen;
                       scoreValue = - BUMPweight * slen;
                       score   += scoreValue;
                       tBscore += scoreValue;
                   }
                   else { /* H-bond */
                       hs += 1.0;
                       slen = 0.5*FABS(node->gap);
                       hslen += slen;
                       scoreValue = HBweight * slen;
                       score   += scoreValue;
                       tHscore += scoreValue;
                   }
               }
               else { gs += 1.0; }

               if (method == EXTERNALSURFACE) {
                   a_radius = node->a->radius;
                   psas += (a_radius + probeRad)*(a_radius + probeRad)/(a_radius * a_radius);
               }
               node = node->next;
           }
           if (doit)/* 04/10/2015 SJ changed the if statements in this block to reflect change in dots ordering, see NODEWIDTH in probe.h*/
           {
               if (spike) {
                  // if (j == 0 || j == 1) { /* contact dot */
                   if(j==0 || j ==1 || j ==2) { /* contact dot, and weak H bond*/
                        fprintf(outf, "%7.0f %5.1f%% %9.1f %9.2f\n",
                                gs, 100.0*gs/numSkinDots, score/density,
                                1000.0*score/numSkinDots);
                   }
                  // else if (j == 2 || j == 3) { /* bump */
                   else if (j ==3 || j ==4 || j ==5){ /* bump*/
                        fprintf(outf, "%7.0f %5.1f%% %9.1f %9.2f\n",
                                bs, 100.0*bs/numSkinDots, score/density,
                                1000.0*score/numSkinDots);
                   }
                   else { /* H-bond */
                        fprintf(outf, "%7.0f %5.1f%% %9.1f %9.2f\n",
                                hs, 100.0*hs/numSkinDots, score/density,
                                1000.0*score/numSkinDots);
                   }
               }
               else {
                   fprintf(outf, "%7.0f %5.1f%%\n",
                           gs, 100.0*gs/numSkinDots);
               }
               tgs += gs;
               ths += hs;
               thslen += hslen;
               tbs += bs;
               tbslen += bslen;
               tscore += score;
               if (method == EXTERNALSURFACE) {
                   tsas += psas; /* tally the solvent accessible surface */
               }
           }
       }
   }
   if (spike) {
/*      fprintf(outf, "                                   score/A^2 x 1000\n");*/
      fprintf(outf, "\n     tot contact:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    tgs, 100.0*tgs/numSkinDots, tGscore/density,
		     1000.0*tGscore/numSkinDots);
      fprintf(outf,   "     tot overlap:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    tbs,    100.0*tbs/numSkinDots, tBscore/density,
		     1000.0*tBscore/numSkinDots);
      fprintf(outf,   "     tot  H-bond:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    ths,    100.0*ths/numSkinDots, tHscore/density,
		     1000.0*tHscore/numSkinDots);

      fprintf(outf, "\n       grand tot:  %7.0f %5.1f%% %9.1f %9.2f\n",
		    (tgs+tbs+ths),
		    100.0*(tgs+tbs+ths)/numSkinDots,
		    tscore/density, 1000.0*tscore/numSkinDots);
      fprintf(outf, "\ncontact surface area: %.1f A^2\n",
		     (tgs+tbs+ths)/density);
   }
   else {
      fprintf(outf, "             tot:  %7.0f %5.1f%%\n\n",
		     tgs, 100.0*tgs/numSkinDots);
      fprintf(outf, "   contact surface area: %.1f A^2\n",
		     tgs/density);
      if (method == EXTERNALSURFACE) {
	 fprintf(outf, "accessible surface area: %.1f A^2\n\n",
		     tsas/density);
      }
   }
}